

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_parser_parseBlockExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  int iVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sourcePosition;
  char *pcVar5;
  sysbvm_tuple_t sVar6;
  size_t sVar7;
  bool bVar8;
  sysbvm_tuple_t sVar9;
  sysbvm_tuple_t sVar10;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 0xd) {
    startIndex = state->tokenPosition;
    state->tokenPosition = startIndex + 1;
    bVar8 = false;
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    sVar10 = 0;
    if (iVar1 == 0x12) {
      sVar10 = 0;
      bVar8 = false;
      do {
        iVar1 = sysbvm_parser_lookKindAt(state,0);
        if (iVar1 == 0x12) {
          sVar7 = state->tokenPosition;
          state->tokenPosition = sVar7 + 1;
          iVar1 = sysbvm_parser_lookKindAt(state,0);
          sVar6 = 0xf;
          if (iVar1 == 0x11) {
            state->tokenPosition = state->tokenPosition + 1;
            sVar6 = 0x1f;
          }
          iVar1 = sysbvm_parser_lookKindAt(state,0);
          sVar9 = 0;
          if (iVar1 == 9) {
            state->tokenPosition = state->tokenPosition + 1;
            sVar9 = sysbvm_parser_parseCommaExpression(context,state);
            iVar1 = sysbvm_parser_lookKindAt(state,0);
            if (iVar1 == 10) {
              state->tokenPosition = state->tokenPosition + 1;
              goto LAB_00124b93;
            }
            sVar6 = sysbvm_parser_makeSourcePositionForParserState(context,state);
            pcVar5 = "Expected a right parentheses that specifies the type.";
          }
          else {
LAB_00124b93:
            iVar1 = sysbvm_parser_lookKindAt(state,0);
            if (iVar1 == 2) {
              sVar3 = sysbvm_parser_parseLiteralTokenValue(context,state);
              sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                                (context,state->sourceCode,state->tokenSequence,sVar7,
                                 state->tokenPosition);
              sVar6 = sysbvm_astArgumentNode_create(context,sVar4,sVar6,sVar3,sVar9);
              goto LAB_00124c41;
            }
            sVar6 = sysbvm_parser_makeSourcePositionForParserState(context,state);
            pcVar5 = "Expected an identifier with the argument name.";
          }
          sVar6 = sysbvm_astErrorNode_createWithCString(context,sVar6,pcVar5);
        }
        else {
          sVar6 = sysbvm_parser_makeSourcePositionForParserState(context,state);
          sVar6 = sysbvm_astErrorNode_createWithCString
                            (context,sVar6,"Expected a colon to delimit a block argument.");
        }
LAB_00124c41:
        if (!bVar8) {
          sVar10 = sysbvm_orderedCollection_create(context);
          bVar8 = true;
        }
        sysbvm_orderedCollection_add(context,sVar10,sVar6);
        iVar1 = sysbvm_parser_lookKindAt(state,0);
      } while (iVar1 == 0x12);
    }
    sVar6 = 0xb;
    if ((bVar8) && (iVar1 = sysbvm_parser_lookKindAt(state,0), iVar1 == 0x19)) {
      state->tokenPosition = state->tokenPosition + 1;
      sVar6 = 0x2b;
    }
    sVar9 = 0;
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 == 0x13) {
      state->tokenPosition = state->tokenPosition + 1;
      sVar9 = sysbvm_parser_parseUnaryExpression(context,state);
    }
    iVar2 = sysbvm_parser_lookKindAt(state,0);
    if (iVar2 == 0x14) {
      state->tokenPosition = state->tokenPosition + 1;
    }
    else if (iVar1 == 0x13) {
      sVar10 = sysbvm_parser_makeSourcePositionForParserState(context,state);
      pcVar5 = "Expected a lambda block back.";
      goto LAB_00124df9;
    }
    sVar7 = state->tokenPosition;
    sVar3 = sysbvm_parser_parsePragmaList(context,state);
    sVar4 = sysbvm_parser_parseExpressionListUntil(context,state,SYSBVM_TOKEN_KIND_RCBRACKET);
    sourcePosition =
         sysbvm_parser_makeSourcePositionForTokenRange
                   (context,state->sourceCode,state->tokenSequence,sVar7,state->tokenPosition);
    sVar3 = sysbvm_astSequenceNode_create(context,sourcePosition,sVar3,sVar4);
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 == 0xe) {
      sVar7 = state->tokenPosition + 1;
      state->tokenPosition = sVar7;
      sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                        (context,state->sourceCode,state->tokenSequence,startIndex,sVar7);
      if (iVar2 != 0x14) {
        sVar10 = sysbvm_astLexicalBlockNode_create(context,sVar4,sVar3);
        return sVar10;
      }
      if (sVar10 == 0) {
        sVar10 = sysbvm_orderedCollection_create(context);
      }
      sVar10 = sysbvm_orderedCollection_asArray(context,sVar10);
      sVar10 = sysbvm_astLambdaNode_create(context,sVar4,sVar6,sVar10,sVar9,sVar3);
      return sVar10;
    }
    sVar10 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    pcVar5 = "Expected a right curly bracket.";
  }
  else {
    sVar10 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    pcVar5 = "Expected a left curly bracket.";
  }
LAB_00124df9:
  sVar10 = sysbvm_astErrorNode_createWithCString(context,sVar10,pcVar5);
  return sVar10;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseBlockExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
   if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_LCBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a left curly bracket.");

    size_t startPosition = state->tokenPosition;
    ++state->tokenPosition;

    sysbvm_tuple_t argumentList = SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t resultTypeExpression = SYSBVM_NULL_TUPLE;
    bool hasArguments = false;
    bool hasEllipsis = false;
    bool hasResultType = false;
    bool hasBlockBar = false;
    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COLON)
    {
        sysbvm_tuple_t argument = sysbvm_parser_parseBlockArgument(context, state);

        if(!hasArguments)
        {
            argumentList = sysbvm_orderedCollection_create(context);
            hasArguments = true;
        }

        sysbvm_orderedCollection_add(context, argumentList, argument);
    }

    if(hasArguments && sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_ELLIPSIS)
    {
        hasEllipsis = true;
        ++state->tokenPosition;
    }

    if(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COLON_COLON)
    {
        ++state->tokenPosition;
        hasResultType = true;
        resultTypeExpression = sysbvm_parser_parseUnaryExpression(context, state);
    }

    if(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_BAR)
    {
        hasBlockBar = true;
        ++state->tokenPosition;
    }

    if((hasBlockBar || hasResultType) && !hasBlockBar)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a lambda block back.");

    bool isLambda = hasBlockBar;

    sysbvm_tuple_t sequenceNode = sysbvm_parser_parseSequenceUntil(context, state, SYSBVM_TOKEN_KIND_RCBRACKET);

    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_RCBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a right curly bracket.");

    ++state->tokenPosition;
    size_t endPosition = state->tokenPosition;
    sysbvm_tuple_t sourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition);

    if(isLambda)
    {
        if(!argumentList)
            argumentList = sysbvm_orderedCollection_create(context);

        sysbvm_tuple_t flags = sysbvm_tuple_bitflags_encode(hasEllipsis ? SYSBVM_FUNCTION_FLAGS_VARIADIC : SYSBVM_FUNCTION_FLAGS_NONE);
        return sysbvm_astLambdaNode_create(context, sourcePosition, flags,
            sysbvm_orderedCollection_asArray(context, argumentList),
            resultTypeExpression, sequenceNode);
    }
    else
    {
        return sysbvm_astLexicalBlockNode_create(context, sourcePosition, sequenceNode);
    }
}